

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# powerlaw_dist.hpp
# Opt level: O0

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,param_type *P)

{
  bool bVar1;
  _Ios_Fmtflags _Var2;
  basic_istream<char,_std::char_traits<char>_> *this;
  basic_istream<char,_std::char_traits<char>_> *pbVar3;
  param_type *in_RSI;
  basic_istream<char,_std::char_traits<char>_> *in_RDI;
  fmtflags flags;
  float theta;
  float gamma;
  basic_istream<char,_std::char_traits<char>_> *in_00;
  param_type local_28;
  char local_1f;
  char local_1e;
  char local_1d;
  fmtflags local_1c;
  result_type_conflict1 local_18;
  result_type_conflict1 local_14;
  param_type *local_10;
  basic_istream<char,_std::char_traits<char>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_1c = Catch::clara::std::ios_base::flags
                       ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  this = local_8 + *(long *)(*(long *)local_8 + -0x18);
  _Var2 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var2 = Catch::clara::std::operator|(_Var2,_S_left);
  Catch::clara::std::ios_base::flags((ios_base *)this,_Var2);
  in_00 = local_8;
  local_1d = (char)utility::delim('\0');
  pbVar3 = utility::operator>>(in_00,(delim_c *)this);
  std::istream::operator>>((istream *)pbVar3,&local_14);
  local_1e = (char)utility::delim('\0');
  pbVar3 = utility::operator>>(in_00,(delim_c *)this);
  std::istream::operator>>((istream *)pbVar3,&local_18);
  local_1f = (char)utility::delim('\0');
  utility::operator>>(in_00,(delim_c *)this);
  bVar1 = std::ios::operator_cast_to_bool((ios *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  if (bVar1) {
    powerlaw_dist<float>::param_type::param_type(&local_28,local_14,local_18);
    *local_10 = local_28;
  }
  Catch::clara::std::ios_base::flags
            ((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)),local_1c);
  return local_8;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, param_type &P) {
        float_t gamma, theta;
        std::ios_base::fmtflags flags(in.flags());
        in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        in >> utility::delim('(') >> gamma >> utility::delim(' ') >> theta >>
            utility::delim(')');
        if (in)
          P = param_type(gamma, theta);
        in.flags(flags);
        return in;
      }